

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemImpl.cpp
# Opt level: O2

bool efsw::Platform::FileSystem::isRemoteFS(string *directory)

{
  bool bVar1;
  statfs statfsbuf;
  string local_b0;
  statfs local_90;
  
  statfs((directory->_M_dataplus)._M_p,&local_90);
  bVar1 = true;
  if (((((((local_90.f_type != 0x517b) && (local_90.f_type != 0x564c)) &&
         (local_90.f_type != 0x6969)) &&
        (((local_90.f_type != 0xc36400 && (local_90.f_type != 0x1161970)) &&
         ((local_90.f_type != 0xbd00bd0 &&
          ((local_90.f_type != 0x19830326 && (local_90.f_type != 0x47504653)))))))) &&
       ((local_90.f_type != 0x50495045 &&
        (((local_90.f_type != 0x5346414f && (local_90.f_type != 0x61756673)) &&
         (local_90.f_type != 0x65735543)))))) &&
      (((local_90.f_type != 0xff534d42 && (local_90.f_type != 0x6b414653)) &&
       (((local_90.f_type != 0x6e667364 &&
         ((local_90.f_type != 0x73757245 && (local_90.f_type != 0x7461636f)))) &&
        (local_90.f_type != 0xa501fcf5)))))) &&
     (((local_90.f_type != 0xaad7aaea && (local_90.f_type != 0xbacbacbc)) &&
      (local_90.f_type != 0xbeefdead)))) {
    if (local_90.f_type == 0x65735546) {
      std::__cxx11::string::string((string *)&local_b0,(string *)directory);
      bVar1 = isLocalFUSEDirectory(&local_b0);
      bVar1 = !bVar1;
      std::__cxx11::string::~string((string *)&local_b0);
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool FileSystem::isRemoteFS( const std::string& directory ) {
#if EFSW_OS == EFSW_OS_LINUX || EFSW_OS == EFSW_OS_MACOSX || EFSW_OS == EFSW_OS_BSD || \
	EFSW_OS == EFSW_OS_SOLARIS || EFSW_OS == EFSW_OS_ANDROID || EFSW_OS == EFSW_OS_IOS
	struct statfs statfsbuf;

	statfs( directory.c_str(), &statfsbuf );

	switch ( statfsbuf.f_type | 0UL ) {
		case S_MAGIC_FUSEBLK: /* 0x65735546 remote */
		{
#if EFSW_OS == EFSW_OS_LINUX
			return !isLocalFUSEDirectory( directory );
#endif
		}
		case S_MAGIC_AFS:	  /* 0x5346414F remote */
		case S_MAGIC_AUFS:	  /* 0x61756673 remote */
		case S_MAGIC_CEPH:	  /* 0x00C36400 remote */
		case S_MAGIC_CIFS:	  /* 0xFF534D42 remote */
		case S_MAGIC_CODA:	  /* 0x73757245 remote */
		case S_MAGIC_FHGFS:	  /* 0x19830326 remote */
		case S_MAGIC_FUSECTL: /* 0x65735543 remote */
		case S_MAGIC_GFS:	  /* 0x01161970 remote */
		case S_MAGIC_GPFS:	  /* 0x47504653 remote */
		case S_MAGIC_KAFS:	  /* 0x6B414653 remote */
		case S_MAGIC_LUSTRE:  /* 0x0BD00BD0 remote */
		case S_MAGIC_NCP:	  /* 0x564C remote */
		case S_MAGIC_NFS:	  /* 0x6969 remote */
		case S_MAGIC_NFSD:	  /* 0x6E667364 remote */
		case S_MAGIC_OCFS2:	  /* 0x7461636F remote */
		case S_MAGIC_PANFS:	  /* 0xAAD7AAEA remote */
		case S_MAGIC_PIPEFS:  /* 0x50495045 remote */
		case S_MAGIC_SMB:	  /* 0x517B remote */
		case S_MAGIC_SNFS:	  /* 0xBEEFDEAD remote */
		case S_MAGIC_VMHGFS:  /* 0xBACBACBC remote */
		case S_MAGIC_VXFS:	  /* 0xA501FCF5 remote */
		{
			return true;
		}
		default: {
			return false;
		}
	}
#endif

	return false;
}